

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O3

void __thiscall OpenMD::LangevinPiston::saveEta(LangevinPiston *this)

{
  Mat3x3d etaMat;
  Mat3x3d local_48;
  
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = this->eta;
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  Snapshot::setBarostat
            ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,&local_48);
  return;
}

Assistant:

void LangevinPiston::saveEta() {
    Mat3x3d etaMat(0.0);
    etaMat(0, 0) = eta;
    etaMat(1, 1) = eta;
    etaMat(2, 2) = eta;
    snap->setBarostat(etaMat);
  }